

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int experimental_hooks_install_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  hooks_t hooks;
  void *local_50;
  hooks_t local_48;
  
  iVar2 = 0x16;
  if (newlen == 0x20 && (newp != (void *)0x0 && (oldlenp != (size_t *)0x0 && oldp != (void *)0x0)))
  {
    local_48.alloc_hook = *newp;
    local_48.dalloc_hook = *(hook_dalloc *)((long)newp + 8);
    local_48.expand_hook = *(hook_expand *)((long)newp + 0x10);
    local_48.extra = *(void **)((long)newp + 0x18);
    local_50 = duckdb_je_hook_install((tsdn_t *)tsd,&local_48);
    if (local_50 == (void *)0x0) {
      iVar2 = 0xb;
    }
    else {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(void **)oldp = local_50;
        iVar2 = 0;
      }
      else {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        switchD_00b03519::default(oldp,&local_50,__n);
        *oldlenp = __n;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
experimental_hooks_install_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	if (oldp == NULL || oldlenp == NULL|| newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	/*
	 * Note: this is a *private* struct.  This is an experimental interface;
	 * forcing the user to know the jemalloc internals well enough to
	 * extract the ABI hopefully ensures nobody gets too comfortable with
	 * this API, which can change at a moment's notice.
	 */
	hooks_t hooks;
	WRITE(hooks, hooks_t);
	void *handle = hook_install(tsd_tsdn(tsd), &hooks);
	if (handle == NULL) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(handle, void *);

	ret = 0;
label_return:
	return ret;
}